

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setGroupingUsed(DecimalFormat *this,UBool enabled)

{
  if (((this->fields->properties).
       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->groupingUsed ==
      (bool)enabled) {
    return;
  }
  NumberFormat::setGroupingUsed(&this->super_NumberFormat,enabled);
  ((this->fields->properties).super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.
  ptr)->groupingUsed = enabled != '\0';
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setGroupingUsed(UBool enabled) {
    if (UBOOL_TO_BOOL(enabled) == fields->properties->groupingUsed) { return; }
    NumberFormat::setGroupingUsed(enabled); // to set field for compatibility
    fields->properties->groupingUsed = enabled;
    touchNoError();
}